

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O2

int uts_numChildren(Node *parent)

{
  uint uVar1;
  uint uVar2;
  char *__format;
  double dVar3;
  
  switch(type) {
  case BIN:
    if (parent->height == 0) {
      dVar3 = floor(b_0);
      uVar2 = (uint)dVar3;
      break;
    }
    goto LAB_00103aab;
  case GEO:
switchD_00103a6b_caseD_1:
    uVar2 = uts_numChildren_geo(parent);
    break;
  case HYBRID:
    if ((double)parent->height < (double)gen_mx * shiftDepth) goto switchD_00103a6b_caseD_1;
LAB_00103aab:
    uVar2 = uts_numChildren_bin(parent);
    break;
  case BALANCED:
    uVar2 = 0;
    if (parent->height < gen_mx) {
      uVar2 = (uint)b_0;
    }
    break;
  default:
    uts_error("parTreeSearch(): Unknown tree type");
    uVar2 = 0;
  }
  if ((parent->height == 0) && (parent->type == 0)) {
    dVar3 = ceil(b_0);
    uVar1 = (uint)dVar3;
    if ((int)uVar2 <= (int)uVar1) {
      return uVar2;
    }
    __format = "*** Number of children of root truncated from %d to %d\n";
  }
  else {
    if (type == BALANCED) {
      return uVar2;
    }
    if ((int)uVar2 < 0x65) {
      return uVar2;
    }
    __format = "*** Number of children truncated from %d to %d\n";
    uVar1 = 100;
  }
  printf(__format,(ulong)uVar2,(ulong)uVar1);
  return uVar1;
}

Assistant:

int uts_numChildren(Node *parent) {
  int numChildren = 0;

  /* Determine the number of children */
  switch (type) {
    case BIN:
      if (parent->height == 0)
        numChildren = (int) floor(b_0);
      else 
        numChildren = uts_numChildren_bin(parent);
      break;
  
    case GEO:
      numChildren = uts_numChildren_geo(parent);
      break;
    
    case HYBRID:
      if (parent->height < shiftDepth * gen_mx)
        numChildren = uts_numChildren_geo(parent);
      else
        numChildren = uts_numChildren_bin(parent);
      break;
    case BALANCED:
      if (parent->height < gen_mx)
        numChildren = (int) b_0;
      break;
    default:
      uts_error("parTreeSearch(): Unknown tree type");
  }
  
  // limit number of children
  // only a BIN root can have more than MAXNUMCHILDREN
  if (parent->height == 0 && parent->type == BIN) {
    int rootBF = (int) ceil(b_0);
    if (numChildren > rootBF) {
      printf("*** Number of children of root truncated from %d to %d\n",
             numChildren, rootBF);
      numChildren = rootBF;
    }
  }
  else if (type != BALANCED) {
    if (numChildren > MAXNUMCHILDREN) {
      printf("*** Number of children truncated from %d to %d\n", 
             numChildren, MAXNUMCHILDREN);
      numChildren = MAXNUMCHILDREN;
    }
  }

  return numChildren;
}